

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O0

void av1_fwd_txfm2d_32x64_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  int iVar1;
  int height;
  __m128i *in_RSI;
  int i_3;
  int i_2;
  int i_1;
  int i;
  int num_col;
  int num_row;
  int bitrow;
  int bitcol;
  int txfm_size_row;
  int txfm_size_col;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  __m128i *outcoef128;
  __m128i in [512];
  int in_stack_000020d4;
  int in_stack_000020d8;
  int8_t in_stack_000020df;
  __m128i *in_stack_000020e0;
  __m128i *in_stack_000020e8;
  int in_stack_ffffffffffffdf8c;
  __m128i *in_stack_ffffffffffffdf90;
  int in_stack_ffffffffffffdf98;
  int in_stack_ffffffffffffdf9c;
  int in_stack_ffffffffffffdfa0;
  int in_stack_ffffffffffffdfa4;
  longlong local_2028 [4];
  int in_stack_ffffffffffffdffc;
  int in_stack_ffffffffffffe000;
  int in_stack_ffffffffffffe004;
  __m128i *in_stack_ffffffffffffe008;
  __m128i *in_stack_ffffffffffffe010;
  int in_stack_ffffffffffffeff8;
  int in_stack_ffffffffffffeffc;
  __m128i *in_stack_fffffffffffff000;
  __m128i *in_stack_fffffffffffff008;
  
  iVar1 = get_txw_idx('\v');
  height = get_txh_idx('\v');
  load_buffer_32x8n((int16_t *)
                    CONCAT44((int)av1_fwd_cos_bit_col[iVar1][height],
                             (int)av1_fwd_cos_bit_row[iVar1][height]),(__m128i *)0x1000000008,
                    in_stack_ffffffffffffdfa4,in_stack_ffffffffffffdfa0,in_stack_ffffffffffffdf9c,
                    in_stack_ffffffffffffdf98,height);
  for (iVar1 = 0; iVar1 < 8; iVar1 = iVar1 + 1) {
    av1_fdct64_sse4_1(in_stack_000020e8,in_stack_000020e0,in_stack_000020df,in_stack_000020d8,
                      in_stack_000020d4);
  }
  for (iVar1 = 0; iVar1 < 8; iVar1 = iVar1 + 1) {
    col_txfm_16x16_rounding(in_stack_ffffffffffffdf90,in_stack_ffffffffffffdf8c);
  }
  transpose_8nx8n((__m128i *)local_2028,in_RSI,0x20,0x40);
  for (iVar1 = 0; iVar1 < 0x10; iVar1 = iVar1 + 1) {
    av1_fdct32_sse4_1(in_stack_fffffffffffff008,in_stack_fffffffffffff000,in_stack_ffffffffffffeffc,
                      in_stack_ffffffffffffeff8);
  }
  for (iVar1 = 0; iVar1 < 0x20; iVar1 = iVar1 + 1) {
    av1_round_shift_rect_array_32_sse4_1
              (in_stack_ffffffffffffe010,in_stack_ffffffffffffe008,in_stack_ffffffffffffe004,
               in_stack_ffffffffffffe000,in_stack_ffffffffffffdffc);
  }
  return;
}

Assistant:

void av1_fwd_txfm2d_32x64_sse4_1(const int16_t *input, int32_t *coeff,
                                 int stride, TX_TYPE tx_type, int bd) {
  (void)tx_type;
  __m128i in[512];
  __m128i *outcoef128 = (__m128i *)coeff;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_32X64];
  const int txw_idx = get_txw_idx(TX_32X64);
  const int txh_idx = get_txh_idx(TX_32X64);
  const int txfm_size_col = tx_size_wide[TX_32X64];
  const int txfm_size_row = tx_size_high[TX_32X64];
  int bitcol = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int bitrow = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int num_row = txfm_size_row >> 2;
  const int num_col = txfm_size_col >> 2;

  // column transform
  load_buffer_32x8n(input, in, stride, 0, 0, shift[0], txfm_size_row);
  for (int i = 0; i < num_col; i++) {
    av1_fdct64_sse4_1((in + i), (in + i), bitcol, num_col, num_col);
  }
  for (int i = 0; i < num_col; i++) {
    col_txfm_16x16_rounding((in + i * txfm_size_row), -shift[1]);
  }
  transpose_8nx8n(in, outcoef128, txfm_size_col, txfm_size_row);

  // row transform
  for (int i = 0; i < num_row; i++) {
    av1_fdct32_sse4_1((outcoef128 + i), (in + i), bitrow, num_row);
  }
  for (int i = 0; i < txfm_size_col; i++) {
    av1_round_shift_rect_array_32_sse4_1(in + i * 16, outcoef128 + i * 8, 8,
                                         -shift[2], NewSqrt2);
  }
  (void)bd;
}